

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::unary_expr(analysis *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  analysis *in_RSI;
  NodePtr NVar5;
  bool local_262;
  bool local_24a;
  undefined1 local_230 [16];
  token local_220;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [8];
  NodePtr tmp_in_ptr;
  token local_1b8;
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [8];
  NodePtr tmp_cur_ptr;
  token local_130;
  int local_108;
  int local_104;
  undefined1 local_100 [32];
  shared_ptr<dh::TreeNode> local_e0;
  byte local_c9;
  token local_c8;
  token local_a0;
  undefined1 local_70 [40];
  string tmp_str;
  undefined1 local_30 [8];
  NodePtr tmp_ptr;
  analysis *this_local;
  NodePtr *ret;
  
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::shared_ptr<dh::TreeNode>::shared_ptr((shared_ptr<dh::TreeNode> *)this);
  std::shared_ptr<dh::TreeNode>::shared_ptr((shared_ptr<dh::TreeNode> *)local_30);
  std::__cxx11::string::string((string *)(local_70 + 0x20));
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  local_c8._lineno._3_1_ = 0;
  local_c9 = 0;
  token::getVal_abi_cxx11_((token *)local_70);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70,"+");
  local_24a = true;
  if (!bVar1) {
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_(&local_a0);
    local_c8._lineno._3_1_ = 1;
    bVar1 = std::operator==(&local_a0._val,"-");
    local_24a = true;
    if (!bVar1) {
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_(&local_c8);
      local_c9 = 1;
      local_24a = std::operator==(&local_c8._val,"!");
    }
  }
  if ((local_c9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_c8._lineno._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)local_70);
  if (local_24a != false) {
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_((token *)local_100);
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    local_104 = token::getLineno(peVar2);
    std::make_shared<dh::TreeNode,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
               (int *)local_100);
    std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)this,&local_e0);
    std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_e0);
    std::__cxx11::string::~string((string *)local_100);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_108 = 1;
    TreeNode::setNodeKind(peVar3,&local_108);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_130._lineno = 7;
    TreeNode::setKind(peVar3,&local_130._lineno);
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_(&local_130);
    match(in_RSI,&local_130._val);
    std::__cxx11::string::~string((string *)&local_130);
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)local_150,(shared_ptr<dh::TreeNode> *)this);
    do {
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      local_1b8._lineno._3_1_ = 0;
      tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = 0;
      token::getVal_abi_cxx11_((token *)local_170);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_170,"+");
      local_262 = true;
      if (!bVar1) {
        std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &in_RSI->tmp);
        token::getVal_abi_cxx11_((token *)local_190);
        local_1b8._lineno._3_1_ = 1;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_190,"-");
        local_262 = true;
        if (!bVar1) {
          std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &in_RSI->tmp);
          token::getVal_abi_cxx11_(&local_1b8);
          tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = 1;
          local_262 = std::operator==(&local_1b8._val,"!");
        }
      }
      if ((tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           ._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      if ((local_1b8._lineno._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)local_190);
      }
      std::__cxx11::string::~string((string *)local_170);
      if (local_262 == false) {
        primary_expr((analysis *)local_230);
        std::shared_ptr<dh::TreeNode>::operator=
                  ((shared_ptr<dh::TreeNode> *)local_30,(shared_ptr<dh::TreeNode> *)local_230);
        std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_230);
        peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_150);
        TreeNode::appendChild(peVar3,(shared_ptr<dh::TreeNode> *)local_30);
      }
      else {
        std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &in_RSI->tmp);
        token::getVal_abi_cxx11_((token *)local_1f0);
        peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        local_1f4 = token::getLineno(peVar2);
        std::make_shared<dh::TreeNode,std::__cxx11::string,int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (int *)local_1f0);
        std::__cxx11::string::~string((string *)local_1f0);
        peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
        local_1f8 = 1;
        TreeNode::setNodeKind(peVar3,&local_1f8);
        peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
        local_220._lineno = 7;
        TreeNode::setKind(peVar3,&local_220._lineno);
        std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &in_RSI->tmp);
        token::getVal_abi_cxx11_((token *)(local_230 + 0x10));
        match(in_RSI,(string *)(local_230 + 0x10));
        std::__cxx11::string::~string((string *)(local_230 + 0x10));
        peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_150);
        TreeNode::appendChild(peVar3,(NodePtr *)local_1d0);
        std::shared_ptr<dh::TreeNode>::operator=
                  ((shared_ptr<dh::TreeNode> *)local_150,(shared_ptr<dh::TreeNode> *)local_1d0);
        std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_1d0);
      }
    } while( true );
  }
  primary_expr((analysis *)
               &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)this,
             (shared_ptr<dh::TreeNode> *)
             &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<dh::TreeNode>::~shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_30);
  _Var4._M_pi = extraout_RDX;
  if ((tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
      & 1) == 0) {
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::unary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in unary_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr;
	::std::string tmp_str;

	if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::UnaryK);

		match(tmp->getVal());
	} else 
	{
		ret = primary_expr();
		return ret;
	}

	NodePtr tmp_cur_ptr = ret;
	while(1)
	{
		if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
		{
			NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
			tmp_in_ptr->setNodeKind(NodeKind::ExprK);
			tmp_in_ptr->setKind(ExprKind::UnaryK);

			match(tmp->getVal());
			tmp_cur_ptr->appendChild(tmp_in_ptr);
			tmp_cur_ptr = tmp_in_ptr;
		} else 
		{
			tmp_ptr = primary_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);
		}
	}

	return ret;
}